

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StatSkill.cpp
# Opt level: O0

void Handlers::StatSkill_Junk(Character *character,PacketReader *reader)

{
  undefined1 local_48 [8];
  PacketBuilder builder;
  PacketReader *reader_local;
  Character *character_local;
  
  if (character->npc_type == Skills) {
    builder.add_size = (size_t)reader;
    Character::Reset(character);
    PacketBuilder::PacketBuilder((PacketBuilder *)local_48,PACKET_STATSKILL,PACKET_JUNK,0x24);
    PacketBuilder::AddShort((PacketBuilder *)local_48,character->statpoints);
    PacketBuilder::AddShort((PacketBuilder *)local_48,character->skillpoints);
    PacketBuilder::AddShort((PacketBuilder *)local_48,character->hp);
    PacketBuilder::AddShort((PacketBuilder *)local_48,character->maxhp);
    PacketBuilder::AddShort((PacketBuilder *)local_48,character->tp);
    PacketBuilder::AddShort((PacketBuilder *)local_48,character->maxtp);
    PacketBuilder::AddShort((PacketBuilder *)local_48,character->maxsp);
    PacketBuilder::AddShort((PacketBuilder *)local_48,*character->display_str);
    PacketBuilder::AddShort((PacketBuilder *)local_48,*character->display_intl);
    PacketBuilder::AddShort((PacketBuilder *)local_48,*character->display_wis);
    PacketBuilder::AddShort((PacketBuilder *)local_48,*character->display_agi);
    PacketBuilder::AddShort((PacketBuilder *)local_48,*character->display_con);
    PacketBuilder::AddShort((PacketBuilder *)local_48,*character->display_cha);
    PacketBuilder::AddShort((PacketBuilder *)local_48,character->mindam);
    PacketBuilder::AddShort((PacketBuilder *)local_48,character->maxdam);
    PacketBuilder::AddShort((PacketBuilder *)local_48,character->accuracy);
    PacketBuilder::AddShort((PacketBuilder *)local_48,character->evade);
    PacketBuilder::AddShort((PacketBuilder *)local_48,character->armor);
    Character::Send(character,(PacketBuilder *)local_48);
    PacketBuilder::~PacketBuilder((PacketBuilder *)local_48);
  }
  return;
}

Assistant:

void StatSkill_Junk(Character *character, PacketReader &reader)
{
	(void)reader;
	/*int shopid = reader.GetInt();*/

	if (character->npc_type == ENF::Skills)
	{
		character->Reset();

		PacketBuilder builder(PACKET_STATSKILL, PACKET_JUNK, 36);
		builder.AddShort(character->statpoints);
		builder.AddShort(character->skillpoints);
		builder.AddShort(character->hp);
		builder.AddShort(character->maxhp);
		builder.AddShort(character->tp);
		builder.AddShort(character->maxtp);
		builder.AddShort(character->maxsp);
		builder.AddShort(character->display_str);
		builder.AddShort(character->display_intl);
		builder.AddShort(character->display_wis);
		builder.AddShort(character->display_agi);
		builder.AddShort(character->display_con);
		builder.AddShort(character->display_cha);
		builder.AddShort(character->mindam);
		builder.AddShort(character->maxdam);
		builder.AddShort(character->accuracy);
		builder.AddShort(character->evade);
		builder.AddShort(character->armor);

		character->Send(builder);
	}
}